

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O3

int __thiscall QNetworkReplyFileImpl::close(QNetworkReplyFileImpl *this,int __fd)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  void *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  QNetworkReply::close((QNetworkReply *)this,__fd);
  if (((*(long *)(lVar1 + 0x238) != 0) && (*(int *)(*(long *)(lVar1 + 0x238) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x240) != 0)) {
    lVar3 = QObject::thread();
    lVar4 = QObject::thread();
    if (lVar3 == lVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        iVar2 = (**(code **)(**(long **)(lVar1 + 0x240) + 0x70))();
        return iVar2;
      }
      goto LAB_001979f1;
    }
    if ((*(long *)(lVar1 + 0x238) == 0) || (*(int *)(*(long *)(lVar1 + 0x238) + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = *(QObject **)(lVar1 + 0x240);
    }
    local_38 = (void *)0x0;
    pcStack_30 = (char *)0x0;
    local_28 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl(pQVar5,"close",QueuedConnection,1,&local_38,&pcStack_30,&local_28)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
LAB_001979f1:
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyFileImpl::close()
{
    Q_D(QNetworkReplyFileImpl);
    QNetworkReply::close();
    if (d->realFile) {
        if (d->realFile->thread() == thread())
            d->realFile->close();
        else
            QMetaObject::invokeMethod(d->realFile, "close", Qt::QueuedConnection);
    }
}